

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<unsigned_char>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<unsigned_char> min,WrappedType<unsigned_char> max,float gridSize)

{
  char cVar1;
  Ubyte UVar2;
  Ubyte UVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  byte bVar7;
  uint uVar9;
  uint uVar10;
  char cVar11;
  uint uVar12;
  byte bVar13;
  char cVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  byte bVar20;
  char cVar21;
  Ubyte min_00;
  ushort uVar22;
  ulong uVar23;
  bool bVar24;
  uint uVar25;
  float fVar26;
  deRandom rnd;
  uint uVar8;
  
  if (stride == 0) {
    stride = componentCount;
  }
  iVar4 = stride * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar4 = 0;
  }
  pcVar6 = (char *)operator_new__((long)(iVar4 * count + offset));
  deRandom_init(&rnd,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar26 = (float)max.m_value - (float)min.m_value;
    uVar25 = -(uint)(-fVar26 <= fVar26);
    uVar5 = (uint)((float)(~uVar25 & (uint)-fVar26 | (uint)fVar26 & uVar25) * gridSize);
    uVar25 = 8;
    if (8 < (byte)uVar5) {
      uVar25 = uVar5;
    }
    uVar22 = (ushort)uVar25 & 0xff;
    uVar5 = stride * 5;
    uVar18 = 0;
    uVar23 = (ulong)(uint)count;
    if (count < 1) {
      uVar23 = 0;
    }
    iVar17 = 2;
    iVar19 = 3;
    bVar7 = 1;
    uVar12 = offset;
    uVar10 = uVar25;
    uVar9 = uVar5;
    uVar8 = uVar5;
    for (; uVar18 != uVar23; uVar18 = uVar18 + 1) {
      iVar15 = 4;
      do {
        bVar24 = iVar15 == 0;
        iVar15 = iVar15 + -1;
        if (bVar24) break;
        UVar2 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_char>>
                          (&rnd,min.m_value,max.m_value);
        min_00.m_value = (uchar)uVar25;
        bVar7 = UVar2.m_value - UVar2.m_value % min_00.m_value;
        uVar8 = (uint)bVar7;
        UVar2 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_char>>
                          (&rnd,min_00,(Ubyte)(max.m_value - bVar7));
        bVar7 = UVar2.m_value - UVar2.m_value % min_00.m_value;
        UVar2 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_char>>
                          (&rnd,min.m_value,max.m_value);
        bVar20 = UVar2.m_value - UVar2.m_value % min_00.m_value;
        seed = (int)bVar20;
        UVar2 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_char>>
                          (&rnd,min_00,(Ubyte)(max.m_value - bVar20));
        bVar20 = UVar2.m_value - UVar2.m_value % min_00.m_value;
        uVar9 = (uint)bVar20;
        if (componentCount < 3) {
          uVar12 = 0;
          uVar10 = 1;
          break;
        }
        UVar2 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_char>>
                          (&rnd,min.m_value,max.m_value);
        uVar10 = 1;
        if (componentCount != 3) {
          UVar3 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_char>>
                            (&rnd,min.m_value,max.m_value);
          uVar10 = (uint)(byte)(UVar3.m_value - UVar3.m_value % min_00.m_value);
        }
        bVar13 = UVar2.m_value - UVar2.m_value % min_00.m_value;
        uVar12 = (uint)bVar13;
      } while (((ushort)((ushort)bVar13 + (ushort)bVar7) < uVar22) ||
              ((ushort)((short)uVar10 + (ushort)bVar20) < uVar22));
      iVar15 = iVar4 * (int)uVar18;
      cVar1 = (char)uVar8;
      cVar11 = cVar1 + bVar7;
      pcVar6[(long)iVar15 + (long)offset] = cVar1;
      cVar21 = (char)seed;
      pcVar6[(long)iVar15 + (long)offset + 1] = cVar21;
      pcVar6[(long)(iVar15 + stride) + (long)offset] = cVar11;
      pcVar6[(long)(iVar15 + 1 + stride) + (long)offset] = cVar21;
      cVar14 = cVar21 + (char)uVar9;
      lVar16 = (long)(stride * 2 + iVar15);
      pcVar6[lVar16 + offset] = cVar1;
      pcVar6[lVar16 + (long)offset + 1] = cVar14;
      pcVar6[(long)(iVar15 + stride * 3) + (long)offset] = cVar1;
      pcVar6[(long)(iVar15 + 1 + stride * 3) + (long)offset] = cVar14;
      lVar16 = (long)(iVar15 + stride * 4);
      pcVar6[lVar16 + offset] = cVar11;
      pcVar6[lVar16 + (long)offset + 1] = cVar21;
      pcVar6[(long)(int)(iVar15 + uVar5) + (long)offset] = cVar11;
      pcVar6[(long)(int)(iVar15 + uVar5 + 1) + (long)offset] = cVar14;
      if (2 < componentCount) {
        lVar16 = 6;
        iVar15 = iVar17;
        while (bVar24 = lVar16 != 0, lVar16 = lVar16 + -1, bVar24) {
          pcVar6[(long)iVar15 + (long)offset] = (char)uVar12;
          iVar15 = iVar15 + stride;
        }
        if (componentCount != 3) {
          lVar16 = 6;
          iVar15 = iVar19;
          while (bVar24 = lVar16 != 0, lVar16 = lVar16 + -1, bVar24) {
            pcVar6[(long)iVar15 + (long)offset] = (char)uVar10;
            iVar15 = iVar15 + stride;
          }
        }
      }
      iVar17 = iVar17 + iVar4;
      iVar19 = iVar19 + iVar4;
    }
  }
  return pcVar6;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}